

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recipient.c
# Opt level: O2

_Bool COSE_Recipient_Free(HCOSE_RECIPIENT hRecipient)

{
  _Bool _Var1;
  COSE_RecipientInfo *p;
  
  _Var1 = IsValidRecipientHandle(hRecipient);
  if (_Var1) {
    _COSE_RemoveFromList(&RecipientRoot,(COSE *)hRecipient);
    _COSE_Recipient_Free((COSE_RecipientInfo *)hRecipient);
  }
  return _Var1;
}

Assistant:

bool COSE_Recipient_Free(HCOSE_RECIPIENT hRecipient)
{
	if (IsValidRecipientHandle(hRecipient)) {
		COSE_RecipientInfo * p = (COSE_RecipientInfo *)hRecipient;
		_COSE_RemoveFromList(&RecipientRoot, &p->m_encrypt.m_message);

		_COSE_Recipient_Free(p);
		return true;
	}

	return false;
}